

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateFeatureDescriptions
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  Rep *pRVar3;
  pointer pcVar4;
  bool bVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  string local_58;
  ModelDescription *local_38;
  
  uVar2 = (interface->input_).super_RepeatedPtrFieldBase.current_size_;
  if ((int)uVar2 < 1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Models must have one or more inputs.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_58);
  }
  else {
    if (0 < (interface->output_).super_RepeatedPtrFieldBase.current_size_) {
      pRVar3 = (interface->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      lVar8 = 0;
      local_38 = interface;
      do {
        validateFeatureDescription
                  (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar6 + lVar8),
                   modelVersion,true);
        bVar5 = Result::good(__return_storage_ptr__);
        if (!bVar5) {
          return __return_storage_ptr__;
        }
        pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        lVar8 = lVar8 + 8;
      } while ((ulong)uVar2 << 3 != lVar8);
      lVar8 = (long)(local_38->output_).super_RepeatedPtrFieldBase.current_size_;
      pRVar3 = (local_38->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar6 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar6 = (void **)0x0;
      }
      if (lVar8 != 0) {
        lVar7 = 0;
        do {
          validateFeatureDescription
                    (__return_storage_ptr__,*(FeatureDescription **)((long)ppvVar6 + lVar7),
                     modelVersion,false);
          bVar5 = Result::good(__return_storage_ptr__);
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != paVar1) {
            operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
          }
          lVar7 = lVar7 + 8;
        } while (lVar8 * 8 != lVar7);
      }
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Models must have one or more outputs.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescriptions(const Specification::ModelDescription& interface, int modelVersion) {
        // a model must have at least one input and one output
        if (interface.input_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more inputs.");
        }
        if (interface.output_size() < 1) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Models must have one or more outputs.");
        }

        for (const auto& input : interface.input()) {
            Result r = validateFeatureDescription(input, modelVersion, true);
            if (!r.good()) { return r; }
        }

        for (const auto& output : interface.output()) {
            Result r = validateFeatureDescription(output, modelVersion, false);
            if (!r.good()) { return r; }
        }

        // If we got here, all inputs/outputs seem good independently of each other.
        return Result();
    }